

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O3

void __thiscall CoreML::Specification::ModelDescription::Clear(ModelDescription *this)

{
  InternalMetadata *this_00;
  Metadata *this_01;
  ulong uVar1;
  undefined8 *puVar2;
  
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
            (&(this->input_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
            (&(this->output_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
            (&(this->state_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::FunctionDescription>::TypeHandler>
            (&(this->functions_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
            (&(this->traininginput_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::ArenaStringPtr::ClearToEmpty(&this->predictedfeaturename_);
  google::protobuf::internal::ArenaStringPtr::ClearToEmpty(&this->predictedprobabilitiesname_);
  google::protobuf::internal::ArenaStringPtr::ClearToEmpty(&this->defaultfunctionname_);
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  uVar1 = uVar1 & 1;
  if (uVar1 != 0) {
    puVar2 = (undefined8 *)*puVar2;
  }
  this_00 = &(this->super_MessageLite)._internal_metadata_;
  if ((puVar2 == (undefined8 *)0x0) && (this_01 = this->metadata_, this_01 != (Metadata *)0x0)) {
    Metadata::~Metadata(this_01);
    operator_delete(this_01,0x68);
    uVar1 = (ulong)((uint)this_00->ptr_ & 1);
  }
  this->metadata_ = (Metadata *)0x0;
  if (uVar1 != 0) {
    google::protobuf::internal::InternalMetadata::DoClear<std::__cxx11::string>(this_00);
    return;
  }
  return;
}

Assistant:

void ModelDescription::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.ModelDescription)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  input_.Clear();
  output_.Clear();
  state_.Clear();
  functions_.Clear();
  traininginput_.Clear();
  predictedfeaturename_.ClearToEmpty();
  predictedprobabilitiesname_.ClearToEmpty();
  defaultfunctionname_.ClearToEmpty();
  if (GetArenaForAllocation() == nullptr && metadata_ != nullptr) {
    delete metadata_;
  }
  metadata_ = nullptr;
  _internal_metadata_.Clear<std::string>();
}